

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode Variant_decodeBinary(UA_Variant *dst,UA_DataType *_)

{
  UA_Byte *pUVar1;
  undefined1 uVar2;
  byte bVar3;
  UA_DataTypeMember *pUVar4;
  char *pcVar5;
  code *pcVar6;
  UA_StatusCode UVar7;
  UA_StatusCode UVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  UA_DataType *pUVar12;
  long lVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  long lVar17;
  UA_Byte UVar18;
  uint uVar19;
  UA_UInt32 *pUVar20;
  ulong uVar21;
  ushort uVar22;
  undefined2 extraout_DX;
  UA_UInt32 *pUVar23;
  uint uVar24;
  undefined8 uVar25;
  UA_UInt32 *pUVar26;
  UA_UInt32 UVar27;
  undefined4 uVar28;
  undefined8 in_R8;
  UA_UInt16 UVar29;
  UA_DataType *pUVar30;
  long lVar31;
  size_t *psVar32;
  long lVar33;
  UA_Byte *pUVar34;
  byte bVar35;
  undefined1 auStack_58 [8];
  undefined1 auStack_50 [8];
  UA_NodeId local_48;
  
  bVar35 = 0;
code_r0x00112ff7:
  pUVar34 = pos + 1;
  if (end < pUVar34) {
    return 0x80070000;
  }
  bVar3 = *pos;
  pos = pUVar34;
  if (bVar3 == 0) goto LAB_0011321e;
  uVar19 = bVar3 & 0x3f;
  pUVar1 = (UA_Byte *)(ulong)uVar19 + -1;
  if ((UA_Byte *)0x18 < pUVar1) {
    return 0x80070000;
  }
  uVar25 = UA_TYPES + (long)pUVar1;
  dst->type = (UA_DataType *)uVar25;
  pUVar34 = pos;
  if ((char)bVar3 < '\0') {
    auStack_50 = (undefined1  [8])0x1130df;
    UVar7 = Array_decodeBinary(&dst->data,&dst->arrayLength,(UA_DataType *)uVar25);
    if ((bVar3 & 0x40) == 0) {
      return UVar7;
    }
    auStack_50 = (undefined1  [8])0x113103;
    UVar8 = Array_decodeBinary(&dst->arrayDimensions,&dst->arrayDimensionsSize,UA_TYPES + 5);
    return UVar7 | UVar8;
  }
  if (pUVar1 != (UA_Byte *)0x15) {
    auStack_50 = (undefined1  [8])0x11311d;
    pUVar12 = (UA_DataType *)calloc(1,(ulong)UA_TYPES[(long)pUVar1].memSize);
    dst->data = pUVar12;
    pUVar23 = (UA_UInt32 *)end;
    pUVar34 = pos;
    if (pUVar12 == (UA_DataType *)0x0) goto LAB_00113231;
    _ = (UA_DataType *)uVar25;
    dst = (UA_Variant *)pUVar12;
    switch(uVar19) {
    case 0:
      auStack_58 = (undefined1  [8])UA_TYPES;
      auStack_50 = (undefined1  [8])(uVar25 + -(ulong)UA_TYPES[(long)pUVar1].typeIndex * 0x30);
      local_48._0_8_ = (UA_Byte *)(ulong)UA_TYPES[(long)pUVar1].membersSize;
      if ((UA_Byte *)(ulong)UA_TYPES[(long)pUVar1].membersSize == (UA_Byte *)0x0) {
        UVar7 = 0;
      }
      else {
        pUVar34 = (UA_Byte *)0x0;
        local_48.identifier.string.data = (UA_Byte *)uVar25;
        do {
          pUVar1 = pos;
          pUVar4 = ((UA_DataType *)uVar25)->members;
          pUVar30 = (UA_DataType *)
                    ((ulong)((uint)pUVar4[(long)pUVar34].memberTypeIndex * 0x30) +
                    *(long *)(auStack_58 +
                             (ulong)(~(uint)(byte)pUVar4[(long)pUVar34].field_0xb & 1) * 8));
          psVar32 = (size_t *)
                    ((long)&((UA_Variant *)pUVar12)->type + (ulong)pUVar4[(long)pUVar34].padding);
          if ((pUVar4[(long)pUVar34].field_0xb & 2) == 0) {
            uVar21 = 0x19;
            if ((pUVar30->field_0x25 & 1) != 0) {
              uVar21 = (ulong)pUVar30->typeIndex;
            }
            local_48.identifier.string.length = (size_t)pUVar30->memSize;
            UVar7 = (*(code *)(&encodeBinaryJumpTable)[uVar21])(psVar32,pUVar30);
            uVar25 = local_48.identifier.string.length;
            if (UVar7 == 0x80080000) {
              pos = pUVar1;
              UVar7 = exchangeBuffer();
              pUVar4 = pUVar4 + (long)pUVar34;
              pUVar34 = pUVar34 + -1;
              uVar25 = -(ulong)pUVar4->padding;
            }
            pUVar12 = (UA_DataType *)((long)psVar32 + uVar25);
            uVar25 = local_48.identifier.string.data;
          }
          else {
            UVar7 = Array_encodeBinary((void *)psVar32[1],*psVar32,pUVar30);
            pUVar12 = (UA_DataType *)(psVar32 + 2);
          }
          pUVar34 = pUVar34 + 1;
        } while ((pUVar34 < (ulong)local_48._0_8_) && (UVar7 == 0));
      }
      return UVar7;
    case 1:
      UVar7 = 0x80070000;
      if (pos + 1 <= end) {
        *(bool *)&pUVar12->typeName = *pos != '\0';
        UVar7 = 0;
        pos = pos + 1;
      }
      return UVar7;
    case 2:
    case 3:
      UVar7 = 0x80070000;
      if (pos + 1 <= end) {
        *(UA_Byte *)&pUVar12->typeName = *pos;
        pos = pos + 1;
        UVar7 = 0;
      }
      return UVar7;
    case 4:
    case 5:
      UVar7 = 0x80070000;
      if (pos + 2 <= end) {
        *(UA_UInt16 *)&pUVar12->typeName = *(UA_UInt16 *)pos;
        pos = pos + 2;
        UVar7 = 0;
      }
      return UVar7;
    case 6:
    case 7:
    case 10:
    case 0x13:
      UVar7 = 0x80070000;
      if (pos + 4 <= end) {
        *(undefined4 *)&pUVar12->typeName = *(undefined4 *)pos;
        pos = pos + 4;
        UVar7 = 0;
      }
      return UVar7;
    case 8:
    case 9:
    case 0xb:
    case 0xd:
      UVar7 = 0x80070000;
      if (pos + 8 <= end) {
        pUVar12->typeName = *(char **)pos;
        pos = pos + 8;
        UVar7 = 0;
      }
      return UVar7;
    case 0xc:
    case 0xf:
    case 0x10:
      UVar7 = Array_decodeBinary((void **)&pUVar12->typeId,(size_t *)pUVar12,UA_TYPES + 2);
      return UVar7;
    case 0xe:
      uVar19 = 0x80070000;
      if (end < pos + 4) {
        uVar24 = 0x80070000;
      }
      else {
        *(undefined4 *)&pUVar12->typeName = *(undefined4 *)pos;
        pos = pos + 4;
        uVar24 = 0;
      }
      if (pos + 2 <= end) {
        *(undefined2 *)((long)&pUVar12->typeName + 4) = *(undefined2 *)pos;
        pos = pos + 2;
        uVar19 = 0;
      }
      UVar7 = 0x80070000;
      if (end < pos + 2) {
        uVar9 = 0x80070000;
      }
      else {
        *(undefined2 *)((long)&pUVar12->typeName + 6) = *(undefined2 *)pos;
        pos = pos + 2;
        uVar9 = 0;
      }
      if (pos + 8 <= end) {
        UVar7 = uVar19 | uVar24 | uVar9;
        (((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->string).length =
             *(size_t *)pos;
        pos = pos + 8;
      }
      return UVar7;
    case 0x11:
      pUVar20 = (UA_UInt32 *)(pos + 1);
      if (end < pUVar20) {
        return 0x80070000;
      }
      switch(*pos) {
      case '\0':
        pos = (UA_Byte *)pUVar20;
        *(UA_NodeIdType *)((long)&pUVar12->typeName + 4) = UA_NODEIDTYPE_NUMERIC;
        if (pUVar23 < pUVar34 + 2) {
          uVar19 = 0x80070000;
          UVar27 = 0;
        }
        else {
          UVar27 = (UA_UInt32)(byte)*pUVar20;
          uVar19 = 0;
          pos = pUVar34 + 2;
        }
        ((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->numeric = UVar27;
        *(UA_UInt16 *)&pUVar12->typeName = 0;
        break;
      case '\x01':
        pos = (UA_Byte *)pUVar20;
        *(UA_NodeIdType *)((long)&pUVar12->typeName + 4) = UA_NODEIDTYPE_NUMERIC;
        pUVar26 = (UA_UInt32 *)(pUVar34 + 2);
        uVar19 = 0x80070000;
        UVar27 = 0;
        if (pUVar23 < pUVar26) {
          UVar29 = 0;
          uVar24 = 0x80070000;
          pUVar26 = pUVar20;
        }
        else {
          UVar29 = (UA_UInt16)(byte)*pUVar20;
          uVar24 = 0;
          pos = (UA_Byte *)pUVar26;
        }
        *(UA_UInt16 *)&pUVar12->typeName = UVar29;
        if ((ushort *)((long)pUVar26 + 2U) <= pUVar23) {
          UVar27 = (UA_UInt32)(ushort)*pUVar26;
          uVar19 = 0;
          pos = (UA_Byte *)((long)pUVar26 + 2U);
        }
        uVar19 = uVar19 | uVar24;
        ((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->numeric = UVar27;
        break;
      case '\x02':
        pos = (UA_Byte *)pUVar20;
        *(UA_NodeIdType *)((long)&pUVar12->typeName + 4) = UA_NODEIDTYPE_NUMERIC;
        uVar19 = 0x80070000;
        if (pUVar23 < pUVar34 + 3) {
          uVar24 = 0x80070000;
        }
        else {
          *(ushort *)&pUVar12->typeName = (ushort)*pUVar20;
          pUVar20 = (UA_UInt32 *)(pos + 2);
          uVar24 = 0;
          pUVar23 = (UA_UInt32 *)end;
          pos = (UA_Byte *)pUVar20;
        }
        if (pUVar20 + 1 <= pUVar23) {
          ((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->numeric = *pUVar20;
          uVar19 = 0;
          pos = (UA_Byte *)(pUVar20 + 1);
        }
        uVar19 = uVar19 | uVar24;
        break;
      case '\x03':
        pos = (UA_Byte *)pUVar20;
        *(UA_NodeIdType *)((long)&pUVar12->typeName + 4) = UA_NODEIDTYPE_STRING;
        goto LAB_00112a2b;
      case '\x04':
        pos = (UA_Byte *)pUVar20;
        *(UA_NodeIdType *)((long)&pUVar12->typeName + 4) = UA_NODEIDTYPE_GUID;
        uVar24 = 0x80070000;
        if ((UA_DataType *)(pUVar34 + 3) <= pUVar23) {
          *(ushort *)&pUVar12->typeName = (ushort)*pUVar20;
          pos = pos + 2;
          uVar24 = 0;
        }
        uVar19 = Guid_decodeBinary(&((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->
                                    guid,(UA_DataType *)(pUVar34 + 3));
        goto LAB_00112a5d;
      case '\x05':
        pos = (UA_Byte *)pUVar20;
        *(UA_NodeIdType *)((long)&pUVar12->typeName + 4) = UA_NODEIDTYPE_BYTESTRING;
LAB_00112a2b:
        uVar24 = 0x80070000;
        if (pUVar34 + 3 <= pUVar23) {
          *(ushort *)&pUVar12->typeName = (ushort)*pUVar20;
          pos = pos + 2;
          uVar24 = 0;
        }
        uVar19 = Array_decodeBinary(&(((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)
                                     ->string).data,
                                    (size_t *)
                                    &((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->
                                     numeric,UA_TYPES + 2);
LAB_00112a5d:
        uVar19 = uVar19 | uVar24;
        break;
      default:
        uVar19 = 0x80020000;
        pos = (UA_Byte *)pUVar20;
      }
      return uVar19;
    case 0x12:
      UVar7 = 0x80070000;
      if (pos < end) {
        bVar35 = *pos;
        *pos = bVar35 & 0x3f;
        UVar7 = NodeId_decodeBinary((UA_NodeId *)pUVar12,(UA_DataType *)uVar25);
        if ((char)bVar35 < '\0') {
          *(UA_UInt16 *)&pUVar12->typeName = 0;
          UVar8 = Array_decodeBinary((void **)&pUVar12->memSize,
                                     (size_t *)
                                     &((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)
                                      [1].numeric,UA_TYPES + 2);
          UVar7 = UVar7 | UVar8;
        }
        if ((bVar35 & 0x40) != 0) {
          uVar19 = 0x80070000;
          if (pos + 4 <= end) {
            *(undefined4 *)&pUVar12->members = *(undefined4 *)pos;
            uVar19 = 0;
            pos = pos + 4;
          }
          UVar7 = UVar7 | uVar19;
        }
      }
      return UVar7;
    case 0x14:
    case 0x1a:
      bVar35 = UA_TYPES[(long)pUVar1].membersSize;
      local_48._0_8_ = UA_TYPES;
      local_48.identifier.string.data = (UA_Byte *)uVar25;
      local_48.identifier.string.length =
           (size_t)(uVar25 + -(ulong)UA_TYPES[(long)pUVar1].typeIndex * 0x30);
      if (bVar35 == 0) {
        UVar7 = 0;
      }
      else {
        lVar13 = 0;
        UVar7 = 0;
        do {
          pUVar4 = *(UA_DataTypeMember **)(local_48.identifier.string.data + 0x28);
          pUVar30 = (UA_DataType *)
                    ((ulong)((uint)*(ushort *)((long)&pUVar4->memberTypeIndex + lVar13) * 0x30) +
                    *(long *)(&local_48.namespaceIndex +
                             (ulong)(~(uint)(byte)(&pUVar4->field_0xb)[lVar13] & 1) * 4));
          psVar32 = (size_t *)
                    ((long)&((UA_Variant *)pUVar12)->type + (ulong)(&pUVar4->padding)[lVar13]);
          if (((&pUVar4->field_0xb)[lVar13] & 2) == 0) {
            uVar11 = 0x19;
            if ((pUVar30->field_0x25 & 1) != 0) {
              uVar11 = (ulong)pUVar30->typeIndex;
            }
            uVar21 = (ulong)pUVar30->memSize;
            auStack_50 = (undefined1  [8])0x112c28;
            uVar19 = (*(code *)(&decodeBinaryJumpTable)[uVar11])(psVar32,pUVar30);
          }
          else {
            auStack_50 = (undefined1  [8])0x112c36;
            uVar19 = Array_decodeBinary((void **)(psVar32 + 1),psVar32,pUVar30);
            uVar21 = 0x10;
          }
          UVar7 = UVar7 | uVar19;
          pUVar12 = (UA_DataType *)((long)psVar32 + uVar21);
          lVar13 = lVar13 + 0x10;
        } while ((ulong)bVar35 * 0x10 != lVar13);
      }
      return UVar7;
    case 0x15:
      pUVar34 = pos + 1;
      UVar7 = 0x80070000;
      if (pUVar34 <= end) {
        bVar35 = *pos;
        UVar7 = 0;
        pos = pUVar34;
        if ((bVar35 & 1) != 0) {
          UVar7 = Array_decodeBinary((void **)&pUVar12->typeId,(size_t *)pUVar12,UA_TYPES + 2);
        }
        if ((bVar35 & 2) != 0) {
          UVar8 = Array_decodeBinary((void **)((anon_union_16_4_621dfe33_for_identifier *)
                                               &pUVar12->typeId + 1),
                                     (size_t *)
                                     (((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)
                                     ->guid).data4,UA_TYPES + 2);
          UVar7 = UVar7 | UVar8;
        }
      }
      return UVar7;
    case 0x16:
      local_48._0_8_ = (UA_Byte *)0x0;
      local_48.identifier.string.length = 0;
      local_48.identifier.string.data = (UA_Byte *)0x0;
      auStack_50 = (undefined1  [8])0x112d0c;
      UVar7 = NodeId_decodeBinary(&local_48,(UA_DataType *)uVar25);
      uVar19 = 0;
      if (end < pos + 1) {
        UVar18 = '\0';
        uVar19 = 0x80070000;
      }
      else {
        UVar18 = *pos;
        pos = pos + 1;
      }
      pUVar34 = pos;
      UVar8 = 0x80070000;
      if (local_48.identifierType == UA_NODEIDTYPE_NUMERIC) {
        UVar8 = uVar19 | UVar7;
      }
      if (UVar8 == 0) {
        if (UVar18 == '\0') {
          *(undefined4 *)&pUVar12->typeName = 0;
          (((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->string).length =
               local_48._0_8_;
          *(size_t *)((long)&pUVar12->typeId + 8) = local_48.identifier.string.length;
          *(UA_Byte **)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)[1].string =
               local_48.identifier.string.data;
          pUVar12->memSize = 0;
          pUVar12->typeIndex = 0;
          pUVar12->membersSize = '\0';
          pUVar12->field_0x25 = 0;
          pUVar12->binaryEncodingId = 0;
          pUVar12->members = (UA_DataTypeMember *)0x0;
          return 0;
        }
        if (UVar18 == '\x02') {
          *(undefined4 *)&pUVar12->typeName = 2;
        }
        else {
          if (UVar18 != '\x01') {
            return 0x80070000;
          }
          lVar13 = 0;
          do {
            if (local_48.identifier.numeric ==
                *(ushort *)((long)&UA_TYPES[0].binaryEncodingId + lVar13)) {
              auStack_50 = (undefined1  [8])0x112e1d;
              pvVar14 = calloc(1,(ulong)*(ushort *)((long)&UA_TYPES[0].memSize + lVar13));
              *(void **)((long)&pUVar12->typeId + 8) = pvVar14;
              if (pvVar14 == (void *)0x0) {
                return 0x80030000;
              }
              pos = pUVar34 + 4;
              *(undefined4 *)&pUVar12->typeName = 3;
              (((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->string).length =
                   (long)&UA_TYPES[0].typeName + lVar13;
              uVar21 = 0x19;
              if (((&UA_TYPES[0].field_0x25)[lVar13] & 1) != 0) {
                uVar21 = (ulong)*(ushort *)((long)&UA_TYPES[0].typeIndex + lVar13);
              }
              UVar7 = (*(code *)(&decodeBinaryJumpTable)[uVar21])(pvVar14);
              return UVar7;
            }
            lVar13 = lVar13 + 0x30;
          } while (lVar13 != 0x1e90);
          *(undefined4 *)&pUVar12->typeName = 1;
        }
        (((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->string).length =
             local_48._0_8_;
        *(size_t *)((long)&pUVar12->typeId + 8) = local_48.identifier.string.length;
        *(UA_Byte **)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)[1].string =
             local_48.identifier.string.data;
        UVar7 = Array_decodeBinary(&pUVar12->members,(size_t *)&pUVar12->memSize,UA_TYPES + 2);
        return UVar7;
      }
      auStack_50 = (undefined1  [8])0x112d5c;
      deleteMembers_noInit(&local_48,UA_TYPES + 0x10);
      return UVar8;
    case 0x17:
      pUVar34 = pos + 1;
      uVar19 = 0x80070000;
      if (pUVar34 <= end) {
        bVar35 = *pos;
        uVar19 = 0;
        pos = pUVar34;
        if ((bVar35 & 1) != 0) {
          *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 1;
          uVar19 = Variant_decodeBinary
                             ((UA_Variant *)
                              &((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->string
                              ,(UA_DataType *)uVar25);
        }
        if ((bVar35 & 2) != 0) {
          *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 2;
          uVar24 = 0x80070000;
          if (pos + 4 <= end) {
            ((anon_union_16_4_621dfe33_for_identifier *)&pUVar12[1].typeId)->numeric =
                 *(UA_UInt32 *)pos;
            uVar24 = 0;
            pos = pos + 4;
          }
          uVar19 = uVar19 | uVar24;
        }
        if ((bVar35 & 4) != 0) {
          *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 4;
          uVar24 = 0x80070000;
          if (pos + 8 <= end) {
            *(undefined8 *)((long)&pUVar12[1].typeId + 8) = *(undefined8 *)pos;
            uVar24 = 0;
            pos = pos + 8;
          }
          uVar19 = uVar19 | uVar24;
        }
        if ((bVar35 & 0x10) != 0) {
          *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 0x10;
          if (end < pos + 2) {
            uVar22 = *(ushort *)((anon_union_16_4_621dfe33_for_identifier *)&pUVar12[1].typeId + 1);
            uVar24 = 0x80070000;
          }
          else {
            uVar22 = *(ushort *)pos;
            *(ushort *)((anon_union_16_4_621dfe33_for_identifier *)&pUVar12[1].typeId + 1) = uVar22;
            uVar24 = 0;
            pos = pos + 2;
          }
          uVar19 = uVar24 | uVar19;
          if (9999 < uVar22) {
            *(undefined2 *)((anon_union_16_4_621dfe33_for_identifier *)&pUVar12[1].typeId + 1) =
                 9999;
          }
        }
        if ((bVar35 & 8) != 0) {
          *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 8;
          uVar24 = 0x80070000;
          if (pos + 8 <= end) {
            uVar25 = *(undefined8 *)pos;
            pUVar12[1].memSize = (short)uVar25;
            pUVar12[1].typeIndex = (short)((ulong)uVar25 >> 0x10);
            pUVar12[1].membersSize = (char)((ulong)uVar25 >> 0x20);
            pUVar12[1].field_0x25 = (char)((ulong)uVar25 >> 0x28);
            pUVar12[1].binaryEncodingId = (short)((ulong)uVar25 >> 0x30);
            uVar24 = 0;
            pos = pos + 8;
          }
          uVar19 = uVar19 | uVar24;
        }
        if ((bVar35 & 0x20) != 0) {
          *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 0x20;
          if (end < pos + 2) {
            uVar22 = *(ushort *)&pUVar12[1].members;
            uVar24 = 0x80070000;
          }
          else {
            uVar22 = *(ushort *)pos;
            *(ushort *)&pUVar12[1].members = uVar22;
            uVar24 = 0;
            pos = pos + 2;
          }
          uVar19 = uVar24 | uVar19;
          if (9999 < uVar22) {
            *(undefined2 *)&pUVar12[1].members = 9999;
          }
        }
      }
      return uVar19;
    case 0x18:
      goto code_r0x00112ff7;
    case 0x19:
      pUVar34 = pos + 1;
      if (end < pUVar34) {
        return 0x80070000;
      }
      uVar24 = 0;
      local_48.identifier.guid.data4 = (UA_Byte  [8])(UA_Byte *)(ulong)uVar19;
      goto LAB_0011328f;
    default:
      return (UA_StatusCode)UA_TYPES[(long)pUVar1].memSize;
    case 0x26:
    case 0x29:
    case 0x2a:
      return (int)pUVar12->typeName + 4;
    case 0x28:
      return 0x10;
    case 0x2b:
      UVar7 = 0;
      switch(*(UA_NodeIdType *)((long)&pUVar12->typeName + 4)) {
      case UA_NODEIDTYPE_NUMERIC:
        UVar7 = 7;
        if ((((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->numeric < 0x10000) &&
           (*(ushort *)&pUVar12->typeName < 0x100)) {
          UVar7 = 4;
          if (((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->numeric < 0x100) {
            UVar7 = (uint)(*(ushort *)&pUVar12->typeName != 0) * 2 + 2;
          }
        }
        break;
      case UA_NODEIDTYPE_STRING:
      case UA_NODEIDTYPE_BYTESTRING:
        UVar7 = (int)(((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->string).length
                + 7;
        break;
      case UA_NODEIDTYPE_GUID:
        UVar7 = 0x13;
      }
      return UVar7;
    case 0x2c:
      sVar15 = NodeId_calcSizeBinary((UA_NodeId *)pUVar12,(UA_DataType *)uVar25);
      UVar7 = (UA_StatusCode)sVar15;
      if (*(long *)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)[1].string != 0) {
        UVar7 = (UA_StatusCode)sVar15 + 4 +
                (int)*(long *)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)[1].
                               string;
      }
      if (*(int *)&pUVar12->members != 0) {
        UVar7 = UVar7 + 4;
      }
      return UVar7;
    case 0x2e:
    case 0x34:
      bVar35 = UA_TYPES[(long)pUVar1].membersSize;
      local_48._0_8_ = UA_TYPES;
      local_48.identifier.string.data = (UA_Byte *)uVar25;
      local_48.identifier.string.length =
           (size_t)(uVar25 + -(ulong)UA_TYPES[(long)pUVar1].typeIndex * 0x30);
      if (bVar35 == 0) {
        UVar7 = 0;
      }
      else {
        lVar13 = 0;
        lVar33 = 0;
        do {
          pUVar4 = *(UA_DataTypeMember **)(local_48.identifier.string.data + 0x28);
          pUVar30 = (UA_DataType *)
                    ((ulong)((uint)*(ushort *)((long)&pUVar4->memberTypeIndex + lVar13) * 0x30) +
                    *(long *)(&local_48.namespaceIndex +
                             (ulong)(~(uint)(byte)(&pUVar4->field_0xb)[lVar13] & 1) * 4));
          psVar32 = (size_t *)((long)&pUVar12->typeName + (ulong)(&pUVar4->padding)[lVar13]);
          if (((&pUVar4->field_0xb)[lVar13] & 2) == 0) {
            uVar21 = 0x19;
            if ((pUVar30->field_0x25 & 1) != 0) {
              uVar21 = (ulong)pUVar30->typeIndex;
            }
            auStack_50 = (undefined1  [8])0x11361c;
            sVar15 = (*(code *)(&calcSizeBinaryJumpTable)[uVar21])(psVar32,pUVar30);
            uVar21 = (ulong)pUVar30->memSize;
          }
          else {
            auStack_50 = (undefined1  [8])0x113633;
            sVar15 = Array_calcSizeBinary((void *)psVar32[1],*psVar32,pUVar30);
            uVar21 = 0x10;
          }
          lVar33 = lVar33 + sVar15;
          UVar7 = (UA_StatusCode)lVar33;
          pUVar12 = (UA_DataType *)((long)psVar32 + uVar21);
          lVar13 = lVar13 + 0x10;
        } while ((ulong)bVar35 * 0x10 != lVar13);
      }
      return UVar7;
    case 0x2f:
      if ((((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->string).length == 0) {
        UVar7 = 1;
      }
      else {
        UVar7 = (int)pUVar12->typeName + 5;
      }
      if (*(long *)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)[1].string != 0) {
        UVar7 = UVar7 + (int)*(undefined8 *)((long)&pUVar12->typeId + 8) + 4;
      }
      return UVar7;
    case 0x30:
      uVar19 = *(uint *)&pUVar12->typeName;
      if (uVar19 < 3) {
        sVar15 = NodeId_calcSizeBinary
                           ((UA_NodeId *)
                            &((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->string,
                            (UA_DataType *)uVar25);
        if (uVar19 == 0) {
          UVar7 = (int)sVar15 + 1;
        }
        else {
          uVar25._0_2_ = pUVar12->memSize;
          uVar25._2_2_ = pUVar12->typeIndex;
          uVar25._4_1_ = pUVar12->membersSize;
          uVar25._5_1_ = pUVar12->field_0x25;
          uVar25._6_2_ = pUVar12->binaryEncodingId;
          UVar7 = (int)sVar15 + (int)uVar25 + 5;
        }
      }
      else {
        sVar15 = (((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->string).length;
        if (((sVar15 == 0) || (lVar13 = *(long *)((long)&pUVar12->typeId + 8), lVar13 == 0)) ||
           (*(int *)(sVar15 + 0xc) != 0)) {
          UVar7 = 0;
        }
        else {
          sVar16 = NodeId_calcSizeBinary((UA_NodeId *)(sVar15 + 8),(UA_DataType *)uVar25);
          uVar21 = 0x19;
          if ((*(byte *)(sVar15 + 0x25) & 1) != 0) {
            uVar21 = (ulong)*(ushort *)(sVar15 + 0x22);
          }
          iVar10 = (*(code *)(&calcSizeBinaryJumpTable)[uVar21])(lVar13,sVar15);
          UVar7 = (int)sVar16 + 5 + iVar10;
        }
      }
      return UVar7;
    case 0x31:
      bVar35 = *(byte *)&pUVar12->typeName;
      iVar10 = 1;
      if ((bVar35 & 1) != 0) {
        sVar15 = Variant_calcSizeBinary
                           ((UA_Variant *)
                            &((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->string,
                            (UA_DataType *)uVar25);
        iVar10 = (int)sVar15 + 1;
        bVar35 = *(byte *)&pUVar12->typeName;
      }
      return (uint)(bVar35 >> 4 & 2) +
             (uint)(bVar35 & 8) + iVar10 + (uint)(bVar35 * '\x02' & 4) +
             (uint)(bVar35 >> 3 & 2) + (uint)(bVar35 * '\x02' & 8);
    case 0x32:
      pcVar5 = pUVar12->typeName;
      if (pcVar5 == (char *)0x0) {
        return 1;
      }
      lVar13 = *(long *)((long)&pUVar12->typeId + 8);
      if ((lVar13 == 0) &&
         (1 < ((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)[1].string.length)) {
        bVar35 = 0;
        uVar28 = 0;
      }
      else {
        lVar33._0_2_ = pUVar12->memSize;
        lVar33._2_2_ = pUVar12->typeIndex;
        lVar33._4_1_ = pUVar12->membersSize;
        lVar33._5_1_ = pUVar12->field_0x25;
        lVar33._6_2_ = pUVar12->binaryEncodingId;
        uVar28 = (undefined4)CONCAT71((int7)((ulong)in_R8 >> 8),lVar33 != 0);
        bVar35 = 1;
      }
      auStack_58._0_2_ = 0;
      auStack_58._2_2_ = 0;
      auStack_58._4_4_ = UA_NODEIDTYPE_NUMERIC;
      auStack_50 = (undefined1  [8])0x0;
      local_48._0_8_ = (UA_Byte *)0x0;
      local_48.identifier.guid.data4[7] = pcVar5[0x25];
      if ((pcVar5[0x25] & 1U) == 0) {
        auStack_58 = *(undefined1 (*) [8])(pcVar5 + 8);
        auStack_50 = *(undefined1 (*) [8])(pcVar5 + 0x10);
        local_48._0_8_ = *(undefined8 *)(pcVar5 + 0x18);
        if (auStack_58._4_4_ != UA_NODEIDTYPE_NUMERIC) {
          return 0;
        }
        pUVar30 = (UA_DataType *)0x19;
      }
      else {
        pUVar30 = (UA_DataType *)(ulong)*(ushort *)(pcVar5 + 0x22);
      }
      local_48.identifier._8_4_ = uVar28;
      lVar33 = (ulong)bVar35 * 4 + 1;
      UVar7 = (UA_StatusCode)lVar33;
      lVar31 = 1;
      if (bVar35 != 0) {
        lVar31 = lVar13;
      }
      local_48.identifier.string.length = (size_t)pUVar12;
      if (lVar31 != 0) {
        uVar22 = *(ushort *)(pcVar5 + 0x20);
        lVar13 = *(long *)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)[1].string;
        pcVar6 = (code *)(&calcSizeBinaryJumpTable)[(long)pUVar30];
        do {
          if (((ulong)local_48.identifier.string.data & 0x100000000000000) == 0) {
            sVar15 = NodeId_calcSizeBinary((UA_NodeId *)auStack_58,pUVar30);
            lVar33 = lVar33 + sVar15 + 5;
          }
          pUVar30 = *(UA_DataType **)local_48.identifier.string.length;
          lVar17 = (*pcVar6)(lVar13);
          lVar33 = lVar17 + lVar33;
          UVar7 = (UA_StatusCode)lVar33;
          lVar13 = lVar13 + (ulong)uVar22;
          lVar31 = lVar31 + -1;
        } while (lVar31 != 0);
      }
      if (local_48.identifier.guid.data4[0] != '\0') {
        sVar15 = Array_calcSizeBinary
                           (*(UA_DataTypeMember **)(local_48.identifier.string.length + 0x28),
                            (((anon_union_16_4_621dfe33_for_identifier *)
                             (local_48.identifier.string.length + 0x20))->string).length,
                            UA_TYPES + 5);
        UVar7 = UVar7 + (int)sVar15;
      }
      return UVar7;
    case 0x33:
      lVar13 = 0;
      while( true ) {
        bVar35 = *(byte *)&pUVar12->typeName;
        lVar33 = (ulong)(bVar35 >> 1 & 4) +
                 (ulong)(bVar35 & 4) + (ulong)(bVar35 & 1) * 4 + (ulong)(bVar35 & 2) * 2 + 1;
        if ((bVar35 & 0x10) != 0) {
          lVar33 = lVar33 + *(long *)&((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)
                                      [1].string + 4;
        }
        lVar33 = (ulong)(bVar35 >> 3 & 4) + lVar33;
        if ((bVar35 & 0x40) == 0) break;
        pUVar12 = (UA_DataType *)pUVar12[1].typeName;
        lVar13 = lVar13 + lVar33;
      }
      return (int)lVar33 + (int)lVar13;
    case 0x35:
      out(*(undefined4 *)&((UA_DataType *)uVar25)->typeName,extraout_DX);
      out(*(undefined4 *)((long)pUVar1 * 0x30 + 0x13e3b4 + (ulong)bVar35 * -8),extraout_DX);
      uVar2 = in(extraout_DX);
      *(undefined1 *)&pUVar12->typeName = uVar2;
      halt_baddata();
    }
  }
  local_48._0_8_ = (UA_Byte *)0x0;
  local_48.identifier.string.length = 0;
  local_48.identifier.string.data = (UA_Byte *)0x0;
  auStack_50 = (undefined1  [8])0x113091;
  UVar7 = NodeId_decodeBinary(&local_48,_);
  if (UVar7 != 0) {
    return UVar7;
  }
  pUVar1 = pos + 1;
  if (end < pUVar1) {
    auStack_50 = (undefined1  [8])0x1130c4;
    deleteMembers_noInit(&local_48,UA_TYPES + 0x10);
    return 0x80070000;
  }
  if (((*pos == '\x01') && (local_48.identifierType == UA_NODEIDTYPE_NUMERIC)) &&
     (local_48.namespaceIndex == 0)) {
    lVar13 = 0;
    do {
      if (local_48.identifier.numeric == *(ushort *)((long)&UA_TYPES[0].binaryEncodingId + lVar13))
      {
        pos = pUVar1;
        dst->type = (UA_DataType *)((long)&UA_TYPES[0].typeName + lVar13);
        pos = pos + 4;
        goto LAB_001131c8;
      }
      lVar13 = lVar13 + 0x30;
    } while (lVar13 != 0x1e90);
  }
  if (dst->type != (UA_DataType *)0x13e7a0) {
    auStack_50 = (undefined1  [8])DiagnosticInfo_decodeBinary;
    pos = pUVar1;
    __assert_fail("dst->type == &UA_TYPES[21]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                  ,0x1ab3,"UA_StatusCode Variant_decodeBinaryUnwrapExtensionObject(UA_Variant *)");
  }
  auStack_50 = (undefined1  [8])0x1131a9;
  pos = pUVar34;
  deleteMembers_noInit(&local_48,UA_TYPES + 0x10);
  local_48._0_8_ = (UA_Byte *)0x0;
  local_48.identifier.string.length = 0;
  local_48.identifier.string.data = (UA_Byte *)0x0;
LAB_001131c8:
  pUVar12 = dst->type;
  auStack_50 = (undefined1  [8])0x1131da;
  pvVar14 = calloc(1,(ulong)pUVar12->memSize);
  dst->data = pvVar14;
  if (pvVar14 == (void *)0x0) {
LAB_00113231:
    UVar7 = 0x80030000;
  }
  else {
    uVar21 = 0x19;
    if ((pUVar12->field_0x25 & 1) != 0) {
      uVar21 = (ulong)pUVar12->typeIndex;
    }
    auStack_50 = (undefined1  [8])0x113204;
    UVar7 = (*(code *)(&decodeBinaryJumpTable)[uVar21])(pvVar14,pUVar12);
    if (UVar7 == 0) {
LAB_0011321e:
      UVar7 = 0;
    }
    else {
      auStack_50 = (undefined1  [8])0x113214;
      free(dst->data);
      dst->data = (void *)0x0;
    }
  }
  return UVar7;
LAB_0011328f:
  bVar35 = *pos;
  uVar19 = 0;
  pos = pUVar34;
  if ((bVar35 & 1) != 0) {
    *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 1;
    uVar19 = 0x80070000;
    if (pos + 4 <= end) {
      *(UA_NodeIdType *)((long)&pUVar12->typeName + 4) = *(UA_NodeIdType *)pos;
      pos = pos + 4;
      uVar19 = 0;
    }
  }
  if ((bVar35 & 2) != 0) {
    *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 2;
    uVar9 = 0x80070000;
    if (pos + 4 <= end) {
      ((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)->numeric = *(UA_UInt32 *)pos;
      uVar9 = 0;
      pos = pos + 4;
    }
    uVar19 = uVar19 | uVar9;
  }
  if ((bVar35 & 4) != 0) {
    *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 4;
    uVar9 = 0x80070000;
    if (pos + 4 <= end) {
      *(undefined4 *)((long)&pUVar12->typeId + 4) = *(undefined4 *)pos;
      uVar9 = 0;
      pos = pos + 4;
    }
    uVar19 = uVar19 | uVar9;
  }
  if ((bVar35 & 8) != 0) {
    *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 8;
    uVar9 = 0x80070000;
    if (pos + 4 <= end) {
      *(undefined4 *)((long)&pUVar12->typeId + 8) = *(undefined4 *)pos;
      uVar9 = 0;
      pos = pos + 4;
    }
    uVar19 = uVar19 | uVar9;
  }
  if ((bVar35 & 0x10) != 0) {
    *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 0x10;
    local_48.identifier.string.length = 0x11338d;
    UVar7 = Array_decodeBinary((void **)&pUVar12->memSize,
                               (size_t *)
                               &((anon_union_16_4_621dfe33_for_identifier *)&pUVar12->typeId)[1].
                                numeric,UA_TYPES + 2);
    uVar19 = uVar19 | UVar7;
  }
  if ((bVar35 & 0x20) != 0) {
    *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 0x20;
    uVar9 = 0x80070000;
    if (pos + 4 <= end) {
      *(undefined4 *)&pUVar12->members = *(undefined4 *)pos;
      uVar9 = 0;
      pos = pos + 4;
    }
    uVar19 = uVar19 | uVar9;
  }
  if ((bVar35 & 0x40) == 0) goto LAB_00113413;
  local_48.identifier.string.length = 0x1133da;
  pUVar30 = (UA_DataType *)calloc(1,0x38);
  pUVar12[1].typeName = (char *)pUVar30;
  if (pUVar30 == (UA_DataType *)0x0) {
    uVar19 = 0x80030000;
    goto LAB_00113413;
  }
  *(byte *)&pUVar12->typeName = *(byte *)&pUVar12->typeName | 0x40;
  uVar24 = uVar24 | uVar19;
  pUVar34 = pos + 1;
  pUVar12 = pUVar30;
  if (end < pUVar34) {
    uVar19 = 0x80070000;
LAB_00113413:
    return uVar24 | uVar19;
  }
  goto LAB_0011328f;
}

Assistant:

static UA_StatusCode
Variant_decodeBinary(UA_Variant *dst, const UA_DataType *_) {
    /* Decode the encoding byte */
    UA_Byte encodingByte;
    UA_StatusCode retval = Byte_decodeBinary(&encodingByte, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Return early for an empty variant (was already _inited) */
    if(encodingByte == 0)
        return UA_STATUSCODE_GOOD;

    /* Does the variant contain an array? */
    const UA_Boolean isArray = (encodingByte & UA_VARIANT_ENCODINGMASKTYPE_ARRAY) > 0;

    /* Get the datatype of the content. The type must be a builtin data type.
     * All not-builtin types are wrapped in an ExtensionObject. */
    size_t typeIndex = (size_t)((encodingByte & UA_VARIANT_ENCODINGMASKTYPE_TYPEID_MASK) - 1);
    if(typeIndex > UA_TYPES_DIAGNOSTICINFO)
        return UA_STATUSCODE_BADDECODINGERROR;
    dst->type = &UA_TYPES[typeIndex];

    /* Decode the content */
    if(isArray) {
        retval = Array_decodeBinary(&dst->data, &dst->arrayLength, dst->type);
    } else if(typeIndex != UA_TYPES_EXTENSIONOBJECT) {
        dst->data = UA_new(dst->type);
        if(!dst->data)
            return UA_STATUSCODE_BADOUTOFMEMORY;
        retval = decodeBinaryJumpTable[typeIndex](dst->data, dst->type);
    } else {
        retval = Variant_decodeBinaryUnwrapExtensionObject(dst);
    }

    /* Decode array dimensions */
    if(isArray && (encodingByte & UA_VARIANT_ENCODINGMASKTYPE_DIMENSIONS) > 0)
        retval |= Array_decodeBinary((void**)&dst->arrayDimensions,
                                     &dst->arrayDimensionsSize, &UA_TYPES[UA_TYPES_INT32]);
    return retval;
}